

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_record.cpp
# Opt level: O3

long data_cb_record(cubeb_stream *stream,void *user,void *inputbuffer,void *outputbuffer,
                   long nframes)

{
  long lVar1;
  long lVar2;
  
  lVar2 = -1;
  if ((outputbuffer == (void *)0x0 && (inputbuffer != (void *)0x0 && stream != (cubeb_stream *)0x0))
     && (lVar2 = nframes, 0 < nframes)) {
    lVar1 = 0;
    do {
      if (1.0 <= ABS(*(float *)((long)inputbuffer + lVar1 * 4))) {
        LOCK();
        *(undefined4 *)user = 1;
        UNLOCK();
        return nframes;
      }
      lVar1 = lVar1 + 1;
    } while (nframes != lVar1);
  }
  return lVar2;
}

Assistant:

long data_cb_record(cubeb_stream * stream, void * user, const void * inputbuffer, void * outputbuffer, long nframes)
{
  user_state_record * u = reinterpret_cast<user_state_record*>(user);
  float *b = (float *)inputbuffer;

  if (stream == NULL  || inputbuffer == NULL || outputbuffer != NULL) {
    return CUBEB_ERROR;
  }

  for (long i = 0; i < nframes; i++) {
    if (b[i] <= -1.0 || b[i] >= 1.0) {
      u->invalid_audio_value = 1;
      break;
    }
  }

  return nframes;
}